

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool soul::AST::TypeMetaFunction::performBoolOp(Op op,Type *inputType)

{
  Category CVar1;
  uint uVar2;
  bool bVar3;
  
  switch(op) {
  case isStruct:
    bVar3 = inputType->category == structure;
    break;
  case isArray:
    bVar3 = inputType->category == array;
    break;
  case isDynamicArray:
    CVar1 = inputType->category;
    bVar3 = inputType->boundingSize == 0;
    goto LAB_00222247;
  case isFixedSizeArray:
    CVar1 = inputType->category;
    bVar3 = inputType->boundingSize != 0;
LAB_00222247:
    return (bool)(bVar3 & CVar1 == array);
  case isVector:
    bVar3 = inputType->category == vector;
    break;
  case isPrimitive:
    bVar3 = inputType->category == primitive;
    break;
  case isFloat:
    bVar3 = ((inputType->primitiveType).type & ~void_) == float32;
    break;
  case isFloat32:
    bVar3 = (inputType->primitiveType).type == float32;
    break;
  case isFloat64:
    bVar3 = (inputType->primitiveType).type == float64;
    break;
  case isInt:
    uVar2 = (inputType->primitiveType).type - int32;
    goto LAB_00222233;
  case isInt32:
    bVar3 = (inputType->primitiveType).type == int32;
    break;
  case isInt64:
    bVar3 = (inputType->primitiveType).type == int64;
    break;
  case isScalar:
    bVar3 = Type::isScalar(inputType);
    return bVar3;
  case isString:
    bVar3 = inputType->category == stringLiteral;
    break;
  case isBool:
    bVar3 = (inputType->primitiveType).type == bool_;
    break;
  case isComplex:
    uVar2 = (inputType->primitiveType).type - complex32;
LAB_00222233:
    return uVar2 < 2;
  case isReference:
    return inputType->isRef;
  case isConst:
    return inputType->isConstant;
  default:
    throwInternalCompilerError("performBoolOp",0x782);
  }
  return bVar3;
}

Assistant:

static bool performBoolOp (Op op, const Type& inputType)
        {
            switch (op)
            {
                case Op::isStruct:          return inputType.isStruct();
                case Op::isArray:           return inputType.isArray();
                case Op::isDynamicArray:    return inputType.isUnsizedArray();
                case Op::isFixedSizeArray:  return inputType.isFixedSizeArray();
                case Op::isVector:          return inputType.isVector();
                case Op::isPrimitive:       return inputType.isPrimitive();
                case Op::isFloat:           return inputType.isFloatingPoint();
                case Op::isFloat32:         return inputType.isFloat32();
                case Op::isFloat64:         return inputType.isFloat64();
                case Op::isInt:             return inputType.isInteger();
                case Op::isInt32:           return inputType.isInteger32();
                case Op::isInt64:           return inputType.isInteger64();
                case Op::isScalar:          return inputType.isScalar();
                case Op::isString:          return inputType.isStringLiteral();
                case Op::isBool:            return inputType.isBool();
                case Op::isComplex:         return inputType.isComplex();
                case Op::isReference:       return inputType.isReference();
                case Op::isConst:           return inputType.isConst();

                case Op::none:
                case Op::sourceType:
                case Op::makeConst:
                case Op::makeReference:
                case Op::removeReference:
                case Op::elementType:
                case Op::primitiveType:
                case Op::size:
                default:                    SOUL_ASSERT_FALSE; return false;
            }
        }